

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iir_filter.hpp
# Opt level: O0

void __thiscall IIR_I::filter(IIR_I *this,double *data_in,double *data_out,int len)

{
  int local_2c;
  int local_28;
  int k;
  int i;
  int len_local;
  double *data_out_local;
  double *data_in_local;
  IIR_I *this_local;
  
  this->m_py[1] = 1.0;
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    *this->m_px = data_in[local_2c];
    *this->m_py = 0.0;
    for (local_28 = 0; local_28 <= this->m_num_order; local_28 = local_28 + 1) {
      *this->m_py = this->m_pNum[local_28] * this->m_px[local_28] + *this->m_py;
    }
    for (local_28 = 1; local_28 <= this->m_den_order; local_28 = local_28 + 1) {
      *this->m_py = -this->m_pDen[local_28] * this->m_py[local_28] + *this->m_py;
    }
    for (local_28 = this->m_num_order; 0 < local_28; local_28 = local_28 + -1) {
      this->m_px[local_28] = this->m_px[local_28 + -1];
    }
    for (local_28 = this->m_den_order; 0 < local_28; local_28 = local_28 + -1) {
      this->m_py[local_28] = this->m_py[local_28 + -1];
    }
    data_out[local_2c] = *this->m_py;
  }
  return;
}

Assistant:

void IIR_I::filter(double data_in[], double data_out[], int len)
{
    int i, k;
    m_py[1] = 1; //修改的地方，因为公式中y[n-k]，当为第一个元素时会出现y[-1]，pcen中y[-1]会被认为为1。
    for(k = 0; k < len; k++)
    {
        m_px[0] = data_in[k];
        m_py[0] = 0.0;
        for(i = 0; i <= m_num_order; i++)
        {
            m_py[0] = m_py[0] + m_pNum[i] * m_px[i];
        }
        for(i = 1; i <= m_den_order; i++)
        {
            m_py[0] = m_py[0] - m_pDen[i] * m_py[i];
        }
        for(i = m_num_order; i >= 1; i--)
        {
            m_px[i] = m_px[i-1];
        }
        for(i = m_den_order; i >= 1; i--)
        {
            m_py[i] = m_py[i-1];
        }
        data_out[k] = m_py[0];
    }
}